

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O2

void dump_args(mmt_memory_dump *args,int argc,uint64_t except_ptr)

{
  mmt_buf *pmVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  
  if (argc < 1) {
    argc = 0;
  }
  for (uVar3 = 0; uVar3 != (uint)argc; uVar3 = uVar3 + 1) {
    if (args[uVar3].addr != except_ptr) {
      pmVar1 = args[uVar3].data;
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         addr: 0x%016llx, size: %d, data:",args[uVar3].addr,
                (ulong)pmVar1->len);
      }
      else {
        fprintf(_stdout,"%64s        addr: 0x%016llx, size: %d, data:"," ");
      }
      uVar4 = 0;
      while( true ) {
        uVar2 = pmVar1->len;
        if (uVar2 >> 2 <= uVar4) break;
        fprintf(_stdout," 0x%08x",(ulong)pmVar1[uVar4 + 1].len);
        uVar4 = uVar4 + 1;
      }
      uVar4 = (long)(int)uVar2 & 0xfffffffffffffffc;
      pbVar5 = (byte *)((long)&pmVar1[1].len + uVar4);
      while( true ) {
        if (uVar2 <= (uint)uVar4) break;
        fprintf(_stdout," 0x%02x",(ulong)*pbVar5);
        uVar2 = pmVar1->len;
        pbVar5 = pbVar5 + 1;
        uVar4 = (ulong)((uint)uVar4 + 1);
      }
      fputc(10,_stdout);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  return;
}

Assistant:

void dump_args(struct mmt_memory_dump *args, int argc, uint64_t except_ptr)
{
	int i, j;

	for (i = 0; i < argc; ++i)
	{
		struct mmt_memory_dump *arg = &args[i];
		struct mmt_buf *data = arg->data;
		if (arg->addr == except_ptr)
			continue;
		mmt_log("        addr: 0x%016llx, size: %d, data:",
				(unsigned long long)arg->addr, data->len);
		for (j = 0; j < data->len / 4; ++j)
			mmt_log_cont(" 0x%08x", ((uint32_t *)data->data)[j]);
		for (j = data->len / 4 * 4; j < data->len; ++j)
			mmt_log_cont(" 0x%02x", data->data[j]);
		mmt_log_cont_nl();
	}
}